

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O3

ir_function_signature * __thiscall
anon_unknown.dwarf_e2059::builtin_builder::_invocation_interlock
          (builtin_builder *this,char *intrinsic_name,builtin_available_predicate avail)

{
  exec_list params;
  ir_function_signature *piVar1;
  ir_function *this_00;
  ir_call *ir;
  undefined8 unaff_RBX;
  exec_node *unaff_R14;
  ir_factory body;
  exec_list *peVar2;
  void *pvVar3;
  
  piVar1 = new_sig(&builtins,&glsl_type::_void_type,(builtin_available_predicate)intrinsic_name,0);
  pvVar3 = builtins.mem_ctx;
  peVar2 = &piVar1->body;
  piVar1->field_0x48 = piVar1->field_0x48 | 1;
  this_00 = glsl_symbol_table::get_function((builtins.shader)->symbols,(char *)this);
  params.head_sentinel.prev = (exec_node *)pvVar3;
  params.head_sentinel.next = &peVar2->head_sentinel;
  params.tail_sentinel.next = (exec_node *)unaff_RBX;
  params.tail_sentinel.prev = unaff_R14;
  ir = call((builtin_builder *)this_00,(ir_function *)0x0,
            (ir_variable *)(piVar1->parameters).head_sentinel.next,params);
  ir_builder::ir_factory::emit((ir_factory *)&stack0xffffffffffffffd8,&ir->super_ir_instruction);
  return piVar1;
}

Assistant:

ir_function_signature *
builtin_builder::_invocation_interlock(const char *intrinsic_name,
                                       builtin_available_predicate avail)
{
   MAKE_SIG(glsl_type::void_type, avail, 0);
   body.emit(call(shader->symbols->get_function(intrinsic_name),
                  NULL, sig->parameters));
   return sig;
}